

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

void __thiscall llvm::DWARFVerifier::verifyDebugLineRows(DWARFVerifier *this)

{
  ushort uVar1;
  pointer pFVar2;
  Row *pRVar3;
  StringRef Key;
  StringRef Key_00;
  bool bVar4;
  LineTable *pLVar5;
  raw_ostream *prVar6;
  unsigned_long *puVar7;
  char *pcVar8;
  iterator iVar9;
  unsigned_short *puVar10;
  ulong uVar11;
  uint uVar12;
  DWARFDebugInfoEntry *pDVar13;
  int iVar14;
  pointer pFVar15;
  unsigned_long N;
  Row *Row;
  Row *this_00;
  unit_iterator_range uVar16;
  Optional<unsigned_long> OVar17;
  Optional<llvm::DWARFFormValue> local_138;
  StringRef local_100;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_f0;
  undefined1 local_e8;
  ulong local_e0;
  Prologue *local_d8;
  DWARFDebugInfoEntry *local_d0;
  undefined1 auStack_c8 [8];
  StringMap<unsigned_short,_llvm::MallocAllocator> FullPathMap;
  undefined1 local_a0 [8];
  DWARFDie Die;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_80;
  char *local_78;
  unsigned_long local_70;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_68;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_60;
  string FullPath;
  
  uVar16 = DWARFContext::info_section_units(this->DCtx);
  local_68.value = (unsigned_long)&PTR_home_01127cf0;
  do {
    local_d0 = (DWARFDebugInfoEntry *)uVar16.end_iterator;
    pDVar13 = (DWARFDebugInfoEntry *)uVar16.begin_iterator;
    if (pDVar13 == local_d0) {
      return;
    }
    _local_a0 = DWARFUnit::getUnitDIE
                          ((((__uniq_ptr_data<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>,_true,_true>
                              *)&pDVar13->Offset)->
                           super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                           )._M_t.
                           super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                           .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,true);
    pLVar5 = DWARFContext::getLineTableForUnit
                       (this->DCtx,
                        (((__uniq_ptr_data<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>,_true,_true>
                           *)&pDVar13->Offset)->
                        super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                        )._M_t.
                        super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                        .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl);
    if (pLVar5 != (LineTable *)0x0) {
      local_d8 = &pLVar5->Prologue;
      auStack_c8 = (undefined1  [8])0x0;
      FullPathMap.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
      FullPathMap.super_StringMapImpl.NumBuckets = 0;
      FullPathMap.super_StringMapImpl.NumItems = 0x10;
      pFVar2 = (pLVar5->Prologue).FileNames.
               super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_e0 = ((long)(pLVar5->Prologue).IncludeDirectories.
                        super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pLVar5->Prologue).IncludeDirectories.
                       super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x30 & 0xffffffff;
      uVar12 = 1;
      Die.Die = pDVar13;
      FullPath.field_2._8_8_ = pLVar5;
      for (pFVar15 = (pLVar5->Prologue).FileNames.
                     super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start; pFVar15 != pFVar2;
          pFVar15 = pFVar15 + 1) {
        uVar11 = (ulong)uVar12;
        if (local_e0 < pFVar15->DirIdx) {
          this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
          prVar6 = error(this);
          prVar6 = raw_ostream::operator<<(prVar6,".debug_line[");
          DWARFDie::find(&local_138,(DWARFDie *)local_a0,DW_AT_stmt_list);
          OVar17 = dwarf::toSectionOffset(&local_138);
          local_80 = OVar17.Storage.field_0;
          local_78 = (char *)CONCAT71(local_78._1_7_,OVar17.Storage.hasVal);
          puVar7 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                             ((OptionalStorage<unsigned_long,_true> *)&local_80);
          FullPath._M_dataplus._M_p = "0x%08lx";
          local_60 = local_68;
          FullPath._M_string_length = *puVar7;
          prVar6 = raw_ostream::operator<<(prVar6,(format_object_base *)&local_60);
          prVar6 = raw_ostream::operator<<(prVar6,"].prologue.file_names[");
          prVar6 = raw_ostream::operator<<(prVar6,uVar11);
          prVar6 = raw_ostream::operator<<(prVar6,"].dir_idx contains an invalid index: ");
          prVar6 = raw_ostream::operator<<(prVar6,pFVar15->DirIdx);
          raw_ostream::operator<<(prVar6,"\n");
        }
        local_60.value = (unsigned_long)&FullPath._M_string_length;
        FullPath._M_dataplus._M_p = (pointer)0x0;
        FullPath._M_string_length = FullPath._M_string_length & 0xffffffffffffff00;
        pcVar8 = DWARFUnit::getCompilationDir((DWARFUnit *)(Die.Die)->Offset);
        StringRef::StringRef(&local_100,pcVar8);
        bVar4 = DWARFDebugLine::LineTable::getFileNameByIndex
                          ((LineTable *)FullPath.field_2._8_8_,uVar11,local_100,AbsoluteFilePath,
                           (string *)&local_60);
        if (!bVar4) {
          __assert_fail("HasFullPath && \"Invalid index?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                        ,0x2da,"void llvm::DWARFVerifier::verifyDebugLineRows()");
        }
        Key.Length = (size_t)FullPath._M_dataplus._M_p;
        Key.Data = (char *)local_60.value;
        iVar9 = StringMap<unsigned_short,_llvm::MallocAllocator>::find
                          ((StringMap<unsigned_short,_llvm::MallocAllocator> *)auStack_c8,Key);
        if (iVar9.
            super_StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
            .Ptr == (StringMapEntryBase **)
                    ((long)auStack_c8 +
                    ((ulong)FullPathMap.super_StringMapImpl.TheTable & 0xffffffff) * 8)) {
          Key_00.Length = (size_t)FullPath._M_dataplus._M_p;
          Key_00.Data = (char *)local_60.value;
          puVar10 = StringMap<unsigned_short,_llvm::MallocAllocator>::operator[]
                              ((StringMap<unsigned_short,_llvm::MallocAllocator> *)auStack_c8,Key_00
                              );
          *puVar10 = (unsigned_short)uVar12;
        }
        else if (uVar12 != *(ushort *)
                            (*(long *)iVar9.
                                      super_StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
                                      .Ptr + 8)) {
          prVar6 = warn(this);
          prVar6 = raw_ostream::operator<<(prVar6,".debug_line[");
          DWARFDie::find(&local_138,(DWARFDie *)local_a0,DW_AT_stmt_list);
          OVar17 = dwarf::toSectionOffset(&local_138);
          local_f0 = OVar17.Storage.field_0;
          local_e8 = OVar17.Storage.hasVal;
          puVar7 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                             ((OptionalStorage<unsigned_long,_true> *)&local_f0);
          local_78 = "0x%08lx";
          local_80 = local_68;
          local_70 = *puVar7;
          prVar6 = raw_ostream::operator<<(prVar6,(format_object_base *)&local_80);
          prVar6 = raw_ostream::operator<<(prVar6,"].prologue.file_names[");
          prVar6 = raw_ostream::operator<<(prVar6,uVar11);
          prVar6 = raw_ostream::operator<<(prVar6,"] is a duplicate of file_names[");
          prVar6 = raw_ostream::operator<<
                             (prVar6,(uint)*(ushort *)
                                            (*(long *)iVar9.
                                                  super_StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
                                                  .Ptr + 8));
          raw_ostream::operator<<(prVar6,"]\n");
        }
        uVar12 = uVar12 + 1;
        std::__cxx11::string::~string((string *)&local_60.empty);
      }
      pRVar3 = *(Row **)(FullPath.field_2._8_8_ + 0x80);
      uVar11 = 0;
      N = 0;
      for (this_00 = *(Row **)(FullPath.field_2._8_8_ + 0x78); this_00 != pRVar3;
          this_00 = this_00 + 1) {
        iVar14 = (int)N;
        if ((this_00->Address).Address < uVar11) {
          this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
          prVar6 = error(this);
          prVar6 = raw_ostream::operator<<(prVar6,".debug_line[");
          DWARFDie::find(&local_138,(DWARFDie *)local_a0,DW_AT_stmt_list);
          OVar17 = dwarf::toSectionOffset(&local_138);
          local_80 = OVar17.Storage.field_0;
          local_78 = (char *)CONCAT71(local_78._1_7_,OVar17.Storage.hasVal);
          puVar7 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                             ((OptionalStorage<unsigned_long,_true> *)&local_80);
          FullPath._M_dataplus._M_p = "0x%08lx";
          local_60 = local_68;
          FullPath._M_string_length = *puVar7;
          prVar6 = raw_ostream::operator<<(prVar6,(format_object_base *)&local_60);
          prVar6 = raw_ostream::operator<<(prVar6,"] row[");
          prVar6 = raw_ostream::operator<<(prVar6,N);
          raw_ostream::operator<<(prVar6,"] decreases in address from previous row:\n");
          DWARFDebugLine::Row::dumpTableHeader(this->OS);
          if (iVar14 != 0) {
            DWARFDebugLine::Row::dump
                      ((Row *)((ulong)(iVar14 - 1) * 0x20 + *(long *)(FullPath.field_2._8_8_ + 0x78)
                              ),this->OS);
          }
          DWARFDebugLine::Row::dump(this_00,this->OS);
          raw_ostream::operator<<(this->OS,'\n');
        }
        bVar4 = DWARFDebugLine::Prologue::hasFileAtIndex(local_d8,(ulong)this_00->File);
        if (!bVar4) {
          this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
          uVar1 = *(ushort *)(FullPath.field_2._8_8_ + 0x10);
          prVar6 = error(this);
          prVar6 = raw_ostream::operator<<(prVar6,".debug_line[");
          DWARFDie::find(&local_138,(DWARFDie *)local_a0,DW_AT_stmt_list);
          OVar17 = dwarf::toSectionOffset(&local_138);
          local_80 = OVar17.Storage.field_0;
          local_78 = (char *)CONCAT71(local_78._1_7_,OVar17.Storage.hasVal);
          puVar7 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                             ((OptionalStorage<unsigned_long,_true> *)&local_80);
          FullPath._M_dataplus._M_p = "0x%08lx";
          local_60 = local_68;
          FullPath._M_string_length = *puVar7;
          prVar6 = raw_ostream::operator<<(prVar6,(format_object_base *)&local_60);
          prVar6 = raw_ostream::operator<<(prVar6,"][");
          prVar6 = raw_ostream::operator<<(prVar6,N);
          prVar6 = raw_ostream::operator<<(prVar6,"] has invalid file index ");
          prVar6 = raw_ostream::operator<<(prVar6,(uint)this_00->File);
          prVar6 = raw_ostream::operator<<(prVar6," (valid values are [");
          pcVar8 = "1,";
          if (4 < uVar1) {
            pcVar8 = "0,";
          }
          prVar6 = raw_ostream::operator<<(prVar6,pcVar8);
          prVar6 = raw_ostream::operator<<
                             (prVar6,(*(long *)(FullPath.field_2._8_8_ + 0x68) -
                                     *(long *)(FullPath.field_2._8_8_ + 0x60)) / 0x88);
          pcVar8 = "]";
          if (4 < uVar1) {
            pcVar8 = ")";
          }
          prVar6 = raw_ostream::operator<<(prVar6,pcVar8);
          raw_ostream::operator<<(prVar6,"):\n");
          DWARFDebugLine::Row::dumpTableHeader(this->OS);
          DWARFDebugLine::Row::dump(this_00,this->OS);
          raw_ostream::operator<<(this->OS,'\n');
        }
        if ((this_00->field_0x1d & 4) == 0) {
          uVar11 = (this_00->Address).Address;
        }
        else {
          uVar11 = 0;
        }
        N = (unsigned_long)(iVar14 + 1);
      }
      StringMap<unsigned_short,_llvm::MallocAllocator>::~StringMap
                ((StringMap<unsigned_short,_llvm::MallocAllocator> *)auStack_c8);
      pDVar13 = Die.Die;
    }
    uVar16.end_iterator =
         (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)local_d0;
    uVar16.begin_iterator =
         (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)&pDVar13->Depth;
  } while( true );
}

Assistant:

void DWARFVerifier::verifyDebugLineRows() {
  for (const auto &CU : DCtx.compile_units()) {
    auto Die = CU->getUnitDIE();
    auto LineTable = DCtx.getLineTableForUnit(CU.get());
    // If there is no line table we will have created an error in the
    // .debug_info verifier or in verifyDebugLineStmtOffsets().
    if (!LineTable)
      continue;

    // Verify prologue.
    uint32_t MaxDirIndex = LineTable->Prologue.IncludeDirectories.size();
    uint32_t FileIndex = 1;
    StringMap<uint16_t> FullPathMap;
    for (const auto &FileName : LineTable->Prologue.FileNames) {
      // Verify directory index.
      if (FileName.DirIdx > MaxDirIndex) {
        ++NumDebugLineErrors;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "].prologue.file_names[" << FileIndex
                << "].dir_idx contains an invalid index: " << FileName.DirIdx
                << "\n";
      }

      // Check file paths for duplicates.
      std::string FullPath;
      const bool HasFullPath = LineTable->getFileNameByIndex(
          FileIndex, CU->getCompilationDir(),
          DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath, FullPath);
      assert(HasFullPath && "Invalid index?");
      (void)HasFullPath;
      auto It = FullPathMap.find(FullPath);
      if (It == FullPathMap.end())
        FullPathMap[FullPath] = FileIndex;
      else if (It->second != FileIndex) {
        warn() << ".debug_line["
               << format("0x%08" PRIx64,
                         *toSectionOffset(Die.find(DW_AT_stmt_list)))
               << "].prologue.file_names[" << FileIndex
               << "] is a duplicate of file_names[" << It->second << "]\n";
      }

      FileIndex++;
    }

    // Verify rows.
    uint64_t PrevAddress = 0;
    uint32_t RowIndex = 0;
    for (const auto &Row : LineTable->Rows) {
      // Verify row address.
      if (Row.Address.Address < PrevAddress) {
        ++NumDebugLineErrors;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "] row[" << RowIndex
                << "] decreases in address from previous row:\n";

        DWARFDebugLine::Row::dumpTableHeader(OS);
        if (RowIndex > 0)
          LineTable->Rows[RowIndex - 1].dump(OS);
        Row.dump(OS);
        OS << '\n';
      }

      // Verify file index.
      if (!LineTable->hasFileAtIndex(Row.File)) {
        ++NumDebugLineErrors;
        bool isDWARF5 = LineTable->Prologue.getVersion() >= 5;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "][" << RowIndex << "] has invalid file index " << Row.File
                << " (valid values are [" << (isDWARF5 ? "0," : "1,")
                << LineTable->Prologue.FileNames.size()
                << (isDWARF5 ? ")" : "]") << "):\n";
        DWARFDebugLine::Row::dumpTableHeader(OS);
        Row.dump(OS);
        OS << '\n';
      }
      if (Row.EndSequence)
        PrevAddress = 0;
      else
        PrevAddress = Row.Address.Address;
      ++RowIndex;
    }
  }
}